

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::SoftmaxLoss::forward
          (SoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,
          State *state,real lr,bool backprop)

{
  int iVar1;
  float fVar2;
  Vector *this_00;
  Vector *pVVar3;
  const_reference pvVar4;
  int64_t iVar5;
  real *prVar6;
  element_type *peVar7;
  long in_RCX;
  real a;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Loss *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  double dVar8;
  real alpha;
  real label;
  int32_t i;
  int32_t osz;
  int32_t target;
  int64_t in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  Matrix *in_stack_ffffffffffffff98;
  int64_t i_00;
  Matrix *A;
  int local_34;
  
  (*in_RDI->_vptr_Loss[3])(in_RDI,in_RCX);
  if (in_EDX < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/loss.cc"
                  ,0x14a,
                  "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  this_00 = (Vector *)(long)in_EDX;
  pVVar3 = (Vector *)std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (pVVar3 <= this_00) {
    __assert_fail("targetIndex < targets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/loss.cc"
                  ,0x14b,
                  "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)in_EDX);
  iVar1 = *pvVar4;
  if ((in_R8B & 1) != 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b0f03);
    iVar5 = Matrix::size(in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    for (local_34 = 0; local_34 < (int)iVar5; local_34 = local_34 + 1) {
      i_00 = 0;
      A = (Matrix *)0x3ff0000000000000;
      if (local_34 != iVar1) {
        A = (Matrix *)0x0;
      }
      in_stack_ffffffffffffff90 = (float)(double)A;
      in_stack_ffffffffffffff94 = in_XMM0_Da;
      prVar6 = Vector::operator[]((Vector *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88);
      fVar2 = in_stack_ffffffffffffff94 * (in_stack_ffffffffffffff90 - *prVar6);
      a = (real)((ulong)(in_RCX + 0x30) >> 0x20);
      std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Vector::addRow(this_00,A,i_00,a);
      peVar7 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b0ff3);
      (*peVar7->_vptr_Matrix[3])((ulong)(uint)fVar2,peVar7,in_RCX + 0x10,(long)local_34);
    }
  }
  prVar6 = Vector::operator[]((Vector *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88);
  dVar8 = Loss::log(in_RDI,(double)(ulong)(uint)*prVar6);
  return -SUB84(dVar8,0);
}

Assistant:

real SoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  computeOutput(state);

  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];

  if (backprop) {
    int32_t osz = wo_->size(0);
    for (int32_t i = 0; i < osz; i++) {
      real label = (i == target) ? 1.0 : 0.0;
      real alpha = lr * (label - state.output[i]);
      state.grad.addRow(*wo_, i, alpha);
      wo_->addVectorToRow(state.hidden, i, alpha);
    }
  }
  return -log(state.output[target]);
}